

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::promiseResolvedToThis
          (DeferredThirdPartyClient *this,bool receivedCall)

{
  undefined7 in_register_00000031;
  DebugExpression<bool> _kjCondition;
  Fault f;
  DebugExpression<bool> local_11;
  Fault local_10;
  
  if ((int)CONCAT71(in_register_00000031,receivedCall) != 0) {
    this->needEmbargo = true;
    local_11.value = (this->state).tag == 1;
    if (!local_11.value) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                (&local_10,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x5f6,FAILED,"state.is<Deferred>()","_kjCondition,",&local_11);
      kj::_::Debug::Fault::fatal(&local_10);
    }
  }
  return;
}

Assistant:

void promiseResolvedToThis(bool receivedCall) override {
      if (receivedCall) {
        // A promise resolved to us, and it had received calls that were pipelined. If we end up
        // accepting this capability locally, we will need to use an embargo.
        needEmbargo = true;

        // promiseResolvedToThis() is always called immediately after the resolution capability was
        // received off the wire, so there should not have been a chance for it to have been
        // accepted yet. This is good, because we need to make sure we embargo it on accept.
        //
        // Note that we know for sure that the resolution message could only have created a new
        // `DeferredThirdPartyClient` -- not referred to an existing one -- because:
        // - If the type was `senderHosted` or `senderPromise`, it refers to an import, and we
        //   never place `DeferredThirdPartyClient` directly on the import table. (Its vine is on
        //   the import table, but the `DeferredThirdPartyClient` object itself is not.)
        // - If the type was `receiverHosted` or `receiverAnswer` then promiseResolvedToThis()
        //   would not have been called on it, because `unwrapIfSameConnection()` would have
        //   returned kj::none.
        // - Therefore the only possibility is that the resolve message contained a
        //   `ThirdPartyCapDescriptor`, which casued a fresh `DeferredThirdPartyClient` to be
        //   created.
        //
        // It's good that this all works out, because otherwise we'd probably need to change the
        // embargo protocol so that an embargo could be established *after* accepting the
        // capability.
        KJ_ASSERT(state.is<Deferred>());
      }
    }